

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O1

SQInteger sqstd_fseek(SQFILE file,SQInteger offset,SQInteger origin)

{
  int iVar1;
  SQInteger SVar2;
  
  SVar2 = -1;
  if ((ulong)origin < 3) {
    iVar1 = fseek((FILE *)file,offset,*(int *)(&DAT_001335c8 + origin * 4));
    SVar2 = (SQInteger)iVar1;
  }
  return SVar2;
}

Assistant:

SQInteger sqstd_fseek(SQFILE file, SQInteger offset, SQInteger origin)
{
    SQInteger realorigin;
    switch(origin) {
        case SQ_SEEK_CUR: realorigin = SEEK_CUR; break;
        case SQ_SEEK_END: realorigin = SEEK_END; break;
        case SQ_SEEK_SET: realorigin = SEEK_SET; break;
        default: return -1; //failed
    }
    return fseek((FILE *)file,(long)offset,(int)realorigin);
}